

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeVLD4DupInstruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  _Bool _Var1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint RegNo;
  uint32_t uVar4;
  uint32_t uVar5;
  int iVar6;
  DecodeStatus DVar7;
  uint local_48;
  uint Rd;
  uint align;
  uint inc;
  uint size;
  uint Rm;
  uint Rn;
  DecodeStatus S;
  void *Decoder_local;
  uint64_t Address_local;
  MCInst *pMStack_18;
  uint Insn_local;
  MCInst *Inst_local;
  
  Rm = 3;
  _Rn = Decoder;
  Decoder_local = (void *)Address;
  Address_local._4_4_ = Insn;
  pMStack_18 = Inst;
  uVar2 = fieldFromInstruction_4(Insn,0xc,4);
  uVar3 = fieldFromInstruction_4(Address_local._4_4_,0x16,1);
  RegNo = uVar3 << 4 | uVar2;
  uVar2 = fieldFromInstruction_4(Address_local._4_4_,0x10,4);
  uVar3 = fieldFromInstruction_4(Address_local._4_4_,0,4);
  uVar4 = fieldFromInstruction_4(Address_local._4_4_,6,2);
  uVar5 = fieldFromInstruction_4(Address_local._4_4_,5,1);
  iVar6 = uVar5 + 1;
  uVar5 = fieldFromInstruction_4(Address_local._4_4_,4,1);
  if (uVar4 == 3) {
    if (uVar5 == 0) {
      return MCDisassembler_Fail;
    }
    local_48 = 0x10;
  }
  else if (uVar4 == 2) {
    local_48 = uVar5 << 3;
  }
  else {
    local_48 = (1 << ((byte)uVar4 & 0x1f)) * 4 * uVar5;
  }
  DVar7 = DecodeDPRRegisterClass(pMStack_18,RegNo,(uint64_t)Decoder_local,_Rn);
  _Var1 = Check(&Rm,DVar7);
  if (_Var1) {
    DVar7 = DecodeDPRRegisterClass(pMStack_18,RegNo + iVar6 & 0x1f,(uint64_t)Decoder_local,_Rn);
    _Var1 = Check(&Rm,DVar7);
    if (_Var1) {
      DVar7 = DecodeDPRRegisterClass
                        (pMStack_18,RegNo + iVar6 * 2 & 0x1f,(uint64_t)Decoder_local,_Rn);
      _Var1 = Check(&Rm,DVar7);
      if (_Var1) {
        DVar7 = DecodeDPRRegisterClass
                          (pMStack_18,RegNo + iVar6 * 3 & 0x1f,(uint64_t)Decoder_local,_Rn);
        _Var1 = Check(&Rm,DVar7);
        if (_Var1) {
          if (uVar3 != 0xf) {
            DVar7 = DecodeGPRRegisterClass(pMStack_18,uVar2,(uint64_t)Decoder_local,_Rn);
            _Var1 = Check(&Rm,DVar7);
            if (!_Var1) {
              return MCDisassembler_Fail;
            }
          }
          DVar7 = DecodeGPRRegisterClass(pMStack_18,uVar2,(uint64_t)Decoder_local,_Rn);
          _Var1 = Check(&Rm,DVar7);
          if (_Var1) {
            MCOperand_CreateImm0(pMStack_18,(ulong)local_48);
            if (uVar3 == 0xd) {
              MCOperand_CreateReg0(pMStack_18,0);
            }
            else if (uVar3 != 0xf) {
              DVar7 = DecodeGPRRegisterClass(pMStack_18,uVar3,(uint64_t)Decoder_local,_Rn);
              _Var1 = Check(&Rm,DVar7);
              if (!_Var1) {
                return MCDisassembler_Fail;
              }
            }
            Inst_local._4_4_ = Rm;
          }
          else {
            Inst_local._4_4_ = MCDisassembler_Fail;
          }
        }
        else {
          Inst_local._4_4_ = MCDisassembler_Fail;
        }
      }
      else {
        Inst_local._4_4_ = MCDisassembler_Fail;
      }
    }
    else {
      Inst_local._4_4_ = MCDisassembler_Fail;
    }
  }
  else {
    Inst_local._4_4_ = MCDisassembler_Fail;
  }
  return Inst_local._4_4_;
}

Assistant:

static DecodeStatus DecodeVLD4DupInstruction(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	unsigned Rn, Rm, size, inc, align;
	unsigned Rd = fieldFromInstruction_4(Insn, 12, 4);
	Rd |= fieldFromInstruction_4(Insn, 22, 1) << 4;
	Rn = fieldFromInstruction_4(Insn, 16, 4);
	Rm = fieldFromInstruction_4(Insn, 0, 4);
	size = fieldFromInstruction_4(Insn, 6, 2);
	inc = fieldFromInstruction_4(Insn, 5, 1) + 1;
	align = fieldFromInstruction_4(Insn, 4, 1);

	if (size == 0x3) {
		if (align == 0)
			return MCDisassembler_Fail;
		align = 16;
	} else {
		if (size == 2) {
			align *= 8;
		} else {
			size = 1 << size;
			align *= 4 * size;
		}
	}

	if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeDPRRegisterClass(Inst, (Rd+inc)%32, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeDPRRegisterClass(Inst, (Rd+2*inc)%32, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeDPRRegisterClass(Inst, (Rd+3*inc)%32, Address, Decoder)))
		return MCDisassembler_Fail;
	if (Rm != 0xF) {
		if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
			return MCDisassembler_Fail;
	}

	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;
	MCOperand_CreateImm0(Inst, align);

	if (Rm == 0xD)
		MCOperand_CreateReg0(Inst, 0);
	else if (Rm != 0xF) {
		if (!Check(&S, DecodeGPRRegisterClass(Inst, Rm, Address, Decoder)))
			return MCDisassembler_Fail;
	}

	return S;
}